

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O0

EncodeSignatureByDerResponseStruct *
cfd::js::api::UtilStructApi::EncodeSignatureByDer
          (EncodeSignatureByDerResponseStruct *__return_storage_ptr__,
          EncodeSignatureByDerRequestStruct *request)

{
  EncodeSignatureByDerRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::EncodeSignatureByDerResponseStruct_(const_cfd::js::api::EncodeSignatureByDerRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  EncodeSignatureByDerRequestStruct *pEStack_18;
  anon_class_1_0_00000001 call_func;
  EncodeSignatureByDerRequestStruct *request_local;
  EncodeSignatureByDerResponseStruct *result;
  
  local_1a = 0;
  pEStack_18 = request;
  EncodeSignatureByDerResponseStruct::EncodeSignatureByDerResponseStruct(__return_storage_ptr__);
  this = pEStack_18;
  std::
  function<cfd::js::api::EncodeSignatureByDerResponseStruct(cfd::js::api::EncodeSignatureByDerRequestStruct_const&)>
  ::
  function<cfd::js::api::UtilStructApi::EncodeSignatureByDer(cfd::js::api::EncodeSignatureByDerRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::EncodeSignatureByDerResponseStruct(cfd::js::api::EncodeSignatureByDerRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"EncodeSignatureByDer",&local_129);
  ExecuteStructApi<cfd::js::api::EncodeSignatureByDerRequestStruct,cfd::js::api::EncodeSignatureByDerResponseStruct>
            ((EncodeSignatureByDerResponseStruct *)(local_108 + 0x20),(api *)this,
             (EncodeSignatureByDerRequestStruct *)local_108,&local_128,in_R8);
  EncodeSignatureByDerResponseStruct::operator=
            (__return_storage_ptr__,(EncodeSignatureByDerResponseStruct *)(local_108 + 0x20));
  EncodeSignatureByDerResponseStruct::~EncodeSignatureByDerResponseStruct
            ((EncodeSignatureByDerResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::EncodeSignatureByDerResponseStruct_(const_cfd::js::api::EncodeSignatureByDerRequestStruct_&)>
  ::~function((function<cfd::js::api::EncodeSignatureByDerResponseStruct_(const_cfd::js::api::EncodeSignatureByDerRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

EncodeSignatureByDerResponseStruct UtilStructApi::EncodeSignatureByDer(
    const EncodeSignatureByDerRequestStruct& request) {
  auto call_func = [](const EncodeSignatureByDerRequestStruct& request)
      -> EncodeSignatureByDerResponseStruct {
    EncodeSignatureByDerResponseStruct result;

    SigHashType sighash_type = TransactionStructApiBase::ConvertSigHashType(
        request.sighash_type, request.sighash_anyone_can_pay,
        request.sighash_rangeproof);
    const ByteData der_signature =
        CryptoUtil::ConvertSignatureToDer(request.signature, sighash_type);

    result.signature = der_signature.GetHex();
    return result;
  };

  EncodeSignatureByDerResponseStruct result;
  result = ExecuteStructApi<
      EncodeSignatureByDerRequestStruct, EncodeSignatureByDerResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}